

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolver.cpp
# Opt level: O1

void __thiscall chrono::ChSolver::ArchiveIN(ChSolver *this,ChArchiveIn *marchive)

{
  Type type;
  Type_mapper typemapper;
  Type local_74;
  ChEnumMapper<chrono::ChSolver::Type> local_70;
  Type_mapper local_50;
  char *local_30;
  ChEnumMapper<chrono::ChSolver::Type> *local_28;
  undefined1 local_20;
  
  ChArchiveIn::VersionRead<chrono::ChSolver>(marchive);
  my_enum_mappers::Type_mapper::Type_mapper(&local_50);
  local_74 = (*this->_vptr_ChSolver[2])(this);
  my_enum_mappers::Type_mapper::operator()(&local_70,&local_50,&local_74);
  local_30 = "solver_type";
  local_20 = 0;
  local_28 = &local_70;
  (**(code **)(*(long *)marchive + 0x58))(marchive);
  local_70.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b61520
  ;
  if (local_70.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_70.value_ptr = (Type *)&this->verbose;
  local_70.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9e18f7;
  local_70.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive);
  local_50.super_ChEnumMapper<chrono::ChSolver::Type>.super_ChEnumMapperBase._vptr_ChEnumMapperBase
       = (_func_int **)&PTR_GetValueAsInt_00b61520;
  if (local_50.super_ChEnumMapper<chrono::ChSolver::Type>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super_ChEnumMapper<chrono::ChSolver::Type>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChSolver::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChSolver>();
    // solver type:
    my_enum_mappers::Type_mapper typemapper;
    Type type = GetType();
    marchive >> CHNVP(typemapper(type), "solver_type");
    // stream in all member data:
    marchive >> CHNVP(verbose);
}